

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damagebintobin.cpp
# Opt level: O2

void DoIt(bool validationCheck)

{
  undefined7 in_register_00000039;
  ValidateDamageBin vDBD;
  
  vDBD.super_Validate.lineno_ = 1;
  vDBD.super_Validate.warnings_ = false;
  vDBD.prevBinIndex_ = 0;
  builtin_strncpy(vDBD.super_Validate.fileDescription_,"Damage Bin Dictionary",0x16);
  vDBD.super_Validate.MIN_ID_ = vDBD.super_Validate.lineno_;
  Validate::SkipHeaderRow(&vDBD.super_Validate);
  if ((int)CONCAT71(in_register_00000039,validationCheck) == 0) {
    ValidateDamageBin::ReadDamageBinDictFileNoChecks(&vDBD);
  }
  else {
    ValidateDamageBin::CheckFormat(&vDBD);
    ValidateDamageBin::CheckFirstBin(&vDBD,true);
    ValidateDamageBin::ReadDamageBinDictFile(&vDBD,true);
    ValidateDamageBin::CheckLastBin(&vDBD);
    Validate::PrintSuccessMessage(&vDBD.super_Validate);
  }
  return;
}

Assistant:

void DoIt(const bool validationCheck) {

  ValidateDamageBin vDBD;
  vDBD.SkipHeaderRow();

  if (validationCheck) {

    vDBD.CheckFormat();
    vDBD.CheckFirstBin(true);   // true = convert to binary
    vDBD.ReadDamageBinDictFile(true);   // true = convert to binary
    vDBD.CheckLastBin();
    vDBD.PrintSuccessMessage();

    return;

  }

  vDBD.ReadDamageBinDictFileNoChecks();

}